

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::StartGroup(JunitReporter *this,string *groupName)

{
  ulong uVar1;
  IConfig *pIVar2;
  reference pvVar3;
  long in_RDI;
  value_type *in_stack_fffffffffffffec8;
  Stats *in_stack_fffffffffffffed0;
  Ptr<Catch::IConfig> local_98;
  string local_90 [144];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    in_stack_fffffffffffffed0 = (Stats *)(in_RDI + 0x88);
    Stats::Stats(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
    push_back((vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_> *)
              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    Stats::~Stats(in_stack_fffffffffffffed0);
  }
  else {
    ReporterConfig::fullConfig((ReporterConfig *)in_stack_fffffffffffffec8);
    pIVar2 = Ptr<Catch::IConfig>::operator->(&local_98);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_90);
    Stats::Stats(in_stack_fffffffffffffed0,(string *)in_stack_fffffffffffffec8);
    std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
    push_back((vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_> *)
              in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    Stats::~Stats(in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_90);
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_fffffffffffffed0);
  }
  pvVar3 = std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
           back((vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_> *
                )in_stack_fffffffffffffed0);
  *(reference *)(in_RDI + 0x80) = pvVar3;
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            if( groupName.empty() )
                m_statsForSuites.push_back( Stats( m_config.fullConfig()->name() ) );
            else
                m_statsForSuites.push_back( Stats( groupName ) );
            m_currentStats = &m_statsForSuites.back();
        }